

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
              *eh)

{
  wchar_t wVar1;
  uint uVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  wVar1 = **begin;
  pwVar3 = *begin + 1;
  if (wVar1 == L'0') {
    *begin = pwVar3;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      pwVar4 = pwVar3;
      if (0xccccccc < uVar2) {
        *begin = pwVar4 + -1;
        uVar2 = 0x80000000;
        goto LAB_001760bb;
      }
      uVar2 = (uVar2 * 10 + wVar1) - 0x30;
      if (pwVar4 == end) break;
      wVar1 = *pwVar4;
      pwVar3 = pwVar4 + 1;
    } while ((uint)(wVar1 + L'\xffffffd0') < 10);
    *begin = pwVar4;
    if ((int)uVar2 < 0) {
LAB_001760bb:
      id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error(eh,"number is too big");
    }
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}